

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_iovec_t x9_62_encode_point(EC_GROUP *group,EC_POINT *point,BN_CTX *bn_ctx)

{
  ptls_iovec_t pVar1;
  size_t sVar2;
  BN_CTX *in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  ptls_iovec_t vec;
  uchar *local_10;
  size_t local_8;
  
  local_8 = EC_POINT_point2oct(in_RDI,in_RSI,POINT_CONVERSION_UNCOMPRESSED,(uchar *)0x0,0,in_RDX);
  if (local_8 == 0) {
    local_10 = (uchar *)0x0;
    local_8 = 0;
  }
  else {
    local_10 = (uchar *)malloc(local_8);
    if (local_10 == (uchar *)0x0) {
      local_10 = (uchar *)0x0;
      local_8 = 0;
    }
    else {
      sVar2 = EC_POINT_point2oct(in_RDI,in_RSI,POINT_CONVERSION_UNCOMPRESSED,local_10,local_8,in_RDX
                                );
      if (sVar2 != local_8) {
        free(local_10);
        local_10 = (uchar *)0x0;
        local_8 = 0;
      }
    }
  }
  pVar1.len = local_8;
  pVar1.base = local_10;
  return pVar1;
}

Assistant:

static ptls_iovec_t x9_62_encode_point(const EC_GROUP *group, const EC_POINT *point, BN_CTX *bn_ctx)
{
    ptls_iovec_t vec;

    if ((vec.len = EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, bn_ctx)) == 0)
        return (ptls_iovec_t){NULL};
    if ((vec.base = malloc(vec.len)) == NULL)
        return (ptls_iovec_t){NULL};
    if (EC_POINT_point2oct(group, point, POINT_CONVERSION_UNCOMPRESSED, vec.base, vec.len, bn_ctx) != vec.len) {
        free(vec.base);
        return (ptls_iovec_t){NULL};
    }

    return vec;
}